

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLoop.cpp
# Opt level: O0

uint32_t __thiscall
loop::MessageLoop::post_delayed_task(MessageLoop *this,Closure *task,uint32_t delay)

{
  rep rVar1;
  TaskInfo *this_00;
  TaskInfo *local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  int64_t local_28;
  int64_t time;
  uint32_t id;
  uint32_t delay_local;
  Closure *task_local;
  MessageLoop *this_local;
  
  time._4_4_ = delay;
  _id = task;
  task_local = (Closure *)this;
  time._0_4_ = std::__atomic_base<unsigned_int>::operator++
                         (&(this->m_next_id).super___atomic_base<unsigned_int>,0);
  local_40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_38.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_40);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_38);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
  local_28 = rVar1 + (ulong)time._4_4_;
  this_00 = (TaskInfo *)operator_new(0x30);
  TaskInfo::TaskInfo(this_00,(__int_type_conflict2)time,_id,local_28);
  local_48 = this_00;
  moodycamel::
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::enqueue
            (&this->m_quque,&local_48);
  myutils::SharedSemaphore::post(this->m_sem);
  return (__int_type_conflict2)time;
}

Assistant:

uint32_t MessageLoop::post_delayed_task(const Closure& task, uint32_t delay)
{
    uint32_t id = m_next_id++;
    int64_t time = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count() + delay;
    m_quque.enqueue(new TaskInfo(id, task, time));
    m_sem->post();
    return id;
}